

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_chunks.c
# Opt level: O3

CURLcode cw_chunked_init(Curl_easy *data,Curl_cwriter *writer)

{
  undefined1 *puVar1;
  void *pvVar2;
  
  pvVar2 = writer->ctx;
  puVar1 = &(data->req).field_0xd9;
  *(uint *)puVar1 = *(uint *)puVar1 | 0x1000;
  *(undefined1 *)((long)pvVar2 + 0x50) = 0;
  *(undefined8 *)((long)pvVar2 + 0x28) = 0;
  Curl_dyn_init((dynbuf *)((long)pvVar2 + 0x30),0x1000);
  *(byte *)((long)pvVar2 + 0x62) = *(byte *)((long)pvVar2 + 0x62) & 0xfe;
  return CURLE_OK;
}

Assistant:

static CURLcode cw_chunked_init(struct Curl_easy *data,
                                struct Curl_cwriter *writer)
{
  struct chunked_writer *ctx = writer->ctx;

  data->req.chunk = TRUE;      /* chunks coming our way. */
  Curl_httpchunk_init(data, &ctx->ch, FALSE);
  return CURLE_OK;
}